

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_string.cpp
# Opt level: O1

bool ublib::operator==(Shared_string *lhs,Shared_string *rhs)

{
  element_type *__n;
  int iVar1;
  element_type *__s2;
  bool bVar2;
  
  __n = (element_type *)lhs->length_;
  __s2 = (element_type *)rhs->length_;
  bVar2 = __n == __s2;
  if (bVar2 && __n != (element_type *)0x0) {
    if (__s2 != (element_type *)0x0) {
      __s2 = (rhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    iVar1 = bcmp((lhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,__s2,(size_t)__n);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool operator==(Shared_string const& lhs, Shared_string const& rhs) noexcept {
  return std::string_view(lhs) == std::string_view(rhs);
}